

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

void __thiscall
HighsHessian::product
          (HighsHessian *this,vector<double,_std::allocator<double>_> *solution,
          vector<double,_std::allocator<double>_> *product)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  int *in_RDI;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  size_type in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  value_type vVar6;
  int local_28;
  int local_24;
  
  if (0 < *in_RDI) {
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(value_type_conflict1 *)0x6b6547)
    ;
    for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_24);
      for (local_28 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_24 + 1)
                             ), local_28 < *pvVar3; local_28 = local_28 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_28);
        iVar2 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_28
                           );
        vVar6 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
        dVar1 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)iVar2);
        *pvVar5 = vVar6 * dVar1 + *pvVar5;
      }
    }
  }
  return;
}

Assistant:

void HighsHessian::product(const std::vector<double>& solution,
                           std::vector<double>& product) const {
  if (this->dim_ <= 0) return;
  product.assign(this->dim_, 0);
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
         iEl++) {
      const HighsInt iRow = this->index_[iEl];
      product[iRow] += this->value_[iEl] * solution[iCol];
    }
  }
}